

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O0

void __thiscall glslang::TQualifier::clearLayout(TQualifier *this)

{
  TQualifier *this_local;
  
  clearUniformLayout(this);
  this->layoutPushConstant = false;
  this->layoutBufferReference = false;
  this->layoutPassthrough = false;
  this->layoutViewportRelative = false;
  this->layoutSecondaryViewportRelativeOffset = -0x800;
  this->layoutShaderRecord = false;
  this->layoutFullQuads = false;
  this->layoutQuadDeriv = false;
  this->layoutHitObjectShaderRecordNV = false;
  this->layoutBindlessSampler = false;
  this->layoutBindlessImage = false;
  *(ulong *)&this->field_0x24 = *(ulong *)&this->field_0x24 & 0xfe07ffffffffffff | 0x1f8000000000000
  ;
  this->field_0x2c = 0;
  clearInterstageLayout(this);
  *(ulong *)&this->field_0x24 = *(ulong *)&this->field_0x24 & 0xfff800ffffffffff | 0x7ff0000000000;
  return;
}

Assistant:

void clearLayout()  // all layout
    {
        clearUniformLayout();

        layoutPushConstant = false;
        layoutBufferReference = false;
        layoutPassthrough = false;
        layoutViewportRelative = false;
        // -2048 as the default value indicating layoutSecondaryViewportRelative is not set
        layoutSecondaryViewportRelativeOffset = -2048;
        layoutShaderRecord = false;
        layoutFullQuads = false;
        layoutQuadDeriv = false;
        layoutHitObjectShaderRecordNV = false;
        layoutBindlessSampler = false;
        layoutBindlessImage = false;
        layoutBufferReferenceAlign = layoutBufferReferenceAlignEnd;
        layoutFormat = ElfNone;

        clearInterstageLayout();

        layoutSpecConstantId = layoutSpecConstantIdEnd;
    }